

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O1

string * __thiscall
gl3cts::TextureSwizzle::SmokeTest::prepareOffsets_abi_cxx11_
          (string *__return_storage_ptr__,SmokeTest *this,testCase *test_case)

{
  size_t sVar1;
  TestError *this_00;
  long lVar2;
  size_t position;
  size_t local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  lVar2 = test_case->m_source_texture_target_index * 0x30;
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,"TYPE(VAL_LIST)","");
  if (*(long *)(texture_targets + lVar2 + 0x10) - 1U < 4) {
    local_40 = 0;
    Utils::replaceToken("TYPE",&local_40,
                        *(GLchar **)(&DAT_02106a80 + *(long *)(texture_targets + lVar2 + 0x10) * 8),
                        __return_storage_ptr__);
    lVar2 = *(long *)(texture_targets + lVar2 + 8);
    if (lVar2 != 0) {
      do {
        sVar1 = local_40;
        Utils::replaceToken("VAL_LIST",&local_40,"0, VAL_LIST",__return_storage_ptr__);
        local_40 = sVar1 + 1;
        lVar2 = lVar2 + -1;
      } while (lVar2 != 0);
    }
    Utils::replaceToken(", VAL_LIST",&local_40,"",__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Invalid value",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
             ,0xd32);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

std::string SmokeTest::prepareOffsets(const testCase& test_case)
{
	const _texture_target& target = texture_targets[test_case.m_source_texture_target_index];

	const glw::GLchar* type = DE_NULL;

	std::string offsets = "TYPE(VAL_LIST)";

	switch (target.m_n_derivatives)
	{
	case 1:
		type = "int";
		break;
	case 2:
		type = "ivec2";
		break;
	case 3:
		type = "ivec3";
		break;
	case 4:
		type = "ivec4";
		break;
	default:
		TCU_FAIL("Invalid value");
		break;
	}

	size_t position = 0;

	Utils::replaceToken("TYPE", position, type, offsets);

	for (size_t i = 0; i < target.m_n_coordinates; ++i)
	{
		size_t start_position = position;

		Utils::replaceToken("VAL_LIST", position, "0, VAL_LIST", offsets);

		position = start_position + 1;
	}

	Utils::replaceToken(", VAL_LIST", position, "", offsets);

	return offsets;
}